

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O1

cf_char_t * cf_strncpy_s(cf_char_t *dst,cf_size_t dstsize,cf_char_t *src,cf_size_t srcmax)

{
  ulong src_size;
  cf_void_t *pcVar1;
  ulong uVar2;
  
  if (src != (cf_char_t *)0x0 && dst != (cf_char_t *)0x0) {
    src_size = 0;
    do {
      uVar2 = src_size;
      src_size = uVar2 + 1;
    } while (src[uVar2] != '\0');
    if ((src_size <= dstsize) &&
       (pcVar1 = cf_memcpy_s(dst,dstsize,src,src_size), pcVar1 != (cf_void_t *)0x0)) {
      dst[uVar2] = '\0';
      return dst;
    }
  }
  return (cf_char_t *)0x0;
}

Assistant:

cf_char_t* cf_strncpy_s(cf_char_t* dst, cf_size_t dstsize, const cf_char_t* src, cf_size_t srcmax) {
    cf_size_t srcsize;
    if(!dst || !src) return CF_NULL_PTR;

    srcsize = cf_strlen(src) + 1;
    srcmax = srcmax > srcsize ? srcmax : srcsize;

    if(srcsize > dstsize) return CF_NULL_PTR;
    if(!cf_memcpy_s(dst, dstsize, src, srcsize)) return CF_NULL_PTR;

    dst[srcsize - 1] = '\0';
    return dst;   
}